

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_ngon.cpp
# Opt level: O0

bool ON_ValidateMeshNgonUserData(ON_V4V5_MeshNgonUserData *ngud,ON_Mesh *mesh)

{
  bool bVar1;
  int mesh_V_count_00;
  int mesh_F_count_00;
  int iVar2;
  ON_V4V5_MeshNgon *ngon;
  bool local_31;
  int ngon_count;
  int mesh_F_count;
  int mesh_V_count;
  int i;
  ON_Mesh *mesh_local;
  ON_V4V5_MeshNgonUserData *ngud_local;
  
  if ((ngud == (ON_V4V5_MeshNgonUserData *)0x0) ||
     (ngud->m_ngon_list == (ON_V4V5_MeshNgonList *)0x0)) {
    ngud_local._7_1_ = false;
  }
  else {
    mesh_V_count_00 =
         ON_SimpleArray<ON_3fPoint>::Count(&(mesh->m_V).super_ON_SimpleArray<ON_3fPoint>);
    mesh_F_count_00 = ON_SimpleArray<ON_MeshFace>::Count(&mesh->m_F);
    if ((ngud->m_mesh_V_count == 0) && (ngud->m_mesh_F_count == 0)) {
      ngud->m_mesh_V_count = -1;
      ngud->m_mesh_F_count = -1;
      iVar2 = ON_V4V5_MeshNgonList::V4V5_NgonCount(ngud->m_ngon_list);
      for (mesh_F_count = 0; mesh_F_count < iVar2; mesh_F_count = mesh_F_count + 1) {
        ngon = ON_V4V5_MeshNgonList::V4V5_Ngon(ngud->m_ngon_list,mesh_F_count);
        bVar1 = ON_ValidateNgon(ngon,mesh_V_count_00,mesh_F_count_00);
        if (!bVar1) {
          return false;
        }
      }
      ngud->m_mesh_V_count = mesh_V_count_00;
      ngud->m_mesh_F_count = mesh_F_count_00;
    }
    local_31 = false;
    if (ngud->m_mesh_F_count == mesh_F_count_00) {
      local_31 = ngud->m_mesh_V_count == mesh_V_count_00;
    }
    ngud_local._7_1_ = local_31;
  }
  return ngud_local._7_1_;
}

Assistant:

static 
bool ON_ValidateMeshNgonUserData(
  ON_V4V5_MeshNgonUserData* ngud,
  const ON_Mesh& mesh
  )
{
  int i;
  if ( 0 == ngud || 0 == ngud->m_ngon_list )
    return false;

  const int mesh_V_count = mesh.m_V.Count();
  const int mesh_F_count = mesh.m_F.Count();

  if ( 0 == ngud->m_mesh_V_count && 0 == ngud->m_mesh_F_count )
  {
    // This is old user data that did not have validation counts
    // saved in the file.

    // Set validation counts to -1 so we never do this slow validation again.
    ngud->m_mesh_V_count = -1;
    ngud->m_mesh_F_count = -1;

    const int ngon_count = ngud->m_ngon_list->V4V5_NgonCount();

    for ( i = 0; i < ngon_count; i++ )
    {
      if ( !ON_ValidateNgon(ngud->m_ngon_list->V4V5_Ngon(i),mesh_V_count,mesh_F_count) )
        return false;
    }

    // Set validation counts to proper values because we will 
    // assume this old ngon information is valid since the indices
    // are in range.  This assumption may not be valid, but
    // at least the ngon won't cause a crash.
    ngud->m_mesh_V_count = mesh_V_count;
    ngud->m_mesh_F_count = mesh_F_count;
  }

  return ( ngud->m_mesh_F_count == mesh_F_count && ngud->m_mesh_V_count == mesh_V_count );
}